

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall
ON_MeshNgon::ContentHash(ON_SHA1_Hash *__return_storage_ptr__,ON_MeshNgon *this)

{
  undefined1 local_90 [8];
  ON_SHA1 sha1;
  ON_MeshNgon *this_local;
  
  sha1.m_sha1_hash.m_digest._12_8_ = this;
  ON_SHA1::ON_SHA1((ON_SHA1 *)local_90);
  if ((this->m_Vcount != 0) && (this->m_vi != (uint *)0x0)) {
    ON_SHA1::AccumulateBytes((ON_SHA1 *)local_90,this->m_vi,(ulong)this->m_Vcount << 2);
  }
  if ((this->m_Fcount != 0) && (this->m_fi != (uint *)0x0)) {
    ON_SHA1::AccumulateBytes((ON_SHA1 *)local_90,this->m_fi,(ulong)this->m_Fcount << 2);
  }
  ON_SHA1::Hash(__return_storage_ptr__,(ON_SHA1 *)local_90);
  return __return_storage_ptr__;
}

Assistant:

ON_SHA1_Hash ON_MeshNgon::ContentHash() const
{
  ON_SHA1 sha1;
  if ( m_Vcount > 0 && m_vi )
    sha1.AccumulateBytes(m_vi,m_Vcount*sizeof(m_vi[0]));  
  if ( m_Fcount > 0 && m_fi )
    sha1.AccumulateBytes(m_fi,m_Fcount*sizeof(m_fi[0]));
  return sha1.Hash();
}